

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

int tremove(lua_State *L)

{
  uint uVar1;
  ulong uVar2;
  uint n;
  uint n_00;
  
  luaL_checktype(L,1,5);
  uVar1 = luaL_len(L,1);
  uVar2 = luaL_optinteger(L,2,(long)(int)uVar1);
  n_00 = (uint)uVar2;
  if ((uVar1 != n_00) && ((int)(uVar1 + 1) < (int)n_00 || (int)n_00 < 1)) {
    luaL_argerror(L,1,"position out of bounds");
  }
  lua_rawgeti(L,1,n_00);
  if ((int)n_00 < (int)uVar1) {
    do {
      n = (int)uVar2 + 1;
      lua_rawgeti(L,1,n);
      lua_rawseti(L,1,(int)uVar2);
      uVar2 = (ulong)n;
      n_00 = uVar1;
    } while (uVar1 != n);
  }
  lua_pushnil(L);
  lua_rawseti(L,1,n_00);
  return 1;
}

Assistant:

static int tremove (lua_State *L) {
  int size = aux_getn(L, 1);
  int pos = luaL_optint(L, 2, size);
  if (pos != size)  /* validate 'pos' if given */
    luaL_argcheck(L, 1 <= pos && pos <= size + 1, 1, "position out of bounds");
  lua_rawgeti(L, 1, pos);  /* result = t[pos] */
  for ( ; pos < size; pos++) {
    lua_rawgeti(L, 1, pos+1);
    lua_rawseti(L, 1, pos);  /* t[pos] = t[pos+1] */
  }
  lua_pushnil(L);
  lua_rawseti(L, 1, pos);  /* t[pos] = nil */
  return 1;
}